

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

int __thiscall H264StreamReader::intDecodeNAL(H264StreamReader *this,uint8_t *buff)

{
  byte bVar1;
  int iVar2;
  byte *buff_00;
  
  bVar1 = *buff;
  (this->super_MPEGStreamReader).m_spsPpsFound = false;
  iVar2 = 0;
  switch(bVar1 & 0x1f) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 0x14:
    iVar2 = processSliceNal(this,buff);
    return iVar2;
  case 6:
    iVar2 = processSEI(this,buff);
    if (iVar2 != 0) {
      return iVar2;
    }
    break;
  case 7:
  case 0xf:
    iVar2 = processSPS(this,buff);
    if (iVar2 != 0) {
      return iVar2;
    }
    this->m_spsCounter = this->m_spsCounter + 1;
    break;
  case 8:
    iVar2 = processPPS(this,buff);
    if (iVar2 != 0) {
      return iVar2;
    }
    (this->super_MPEGStreamReader).m_spsPpsFound = true;
    break;
  case 9:
  case 0x18:
    this->m_delimiterFound = true;
    break;
  default:
    goto switchD_0019aff8_caseD_a;
  }
  for (buff_00 = NALUnit::findNextNAL
                           (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd)
      ; buff_00 != (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
      buff_00 = NALUnit::findNextNAL
                          (buff_00,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                   m_bufEnd)) {
    switch(*buff_00 & 0x1f) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 0x14:
      iVar2 = processSliceNal(this,buff_00);
      if (iVar2 != 0) {
        return iVar2;
      }
      (this->super_MPEGStreamReader).m_lastDecodedPos = buff_00;
      return 0;
    case 6:
      iVar2 = processSEI(this,buff_00);
      if (iVar2 != 0) {
        return iVar2;
      }
      break;
    case 7:
    case 0xf:
      iVar2 = processSPS(this,buff_00);
      if (iVar2 != 0) {
        return iVar2;
      }
      this->m_spsCounter = this->m_spsCounter + 1;
      break;
    case 8:
      iVar2 = processPPS(this,buff_00);
      if (iVar2 != 0) {
        return iVar2;
      }
      (this->super_MPEGStreamReader).m_spsPpsFound = true;
      break;
    case 9:
switchD_0019b097_caseD_9:
      this->m_delimiterFound = true;
      break;
    case 0x18:
      if (this->m_blurayMode == true) goto switchD_0019b097_caseD_9;
    }
  }
  iVar2 = -10;
switchD_0019aff8_caseD_a:
  return iVar2;
}

Assistant:

int H264StreamReader::intDecodeNAL(uint8_t *buff)
{
    const auto nal_unit_type = static_cast<NALUnit::NALType>(*buff & 0x1f);
    int nalRez;
    m_spsPpsFound = false;

    // First NAL of Access Unit
    switch (nal_unit_type)
    {
    case NALUnit::NALType::nuPPS:
        // LTRACE(LT_DEBUG, 0, "PPS");
        nalRez = processPPS(buff);
        if (nalRez != 0)
            return nalRez;
        m_spsPpsFound = true;
        break;
    case NALUnit::NALType::nuSPS:
    case NALUnit::NALType::nuSubSPS:
        // LTRACE(LT_DEBUG, 0, "SPS");
        nalRez = processSPS(buff);
        if (nalRez != 0)
            return nalRez;
        m_spsCounter++;
        break;
    case NALUnit::NALType::nuSEI:
        // LTRACE(LT_DEBUG, 0, "SEI");
        nalRez = processSEI(buff);
        if (nalRez != 0)
            return nalRez;
        break;
    case NALUnit::NALType::nuDRD:
    case NALUnit::NALType::nuDelimiter:
        // LTRACE(LT_DEBUG, 0, "NAUD type " << int32ToStr(buff[1],16));
        m_delimiterFound = true;
        break;
    // Remaining NALs of Access Unit
    case NALUnit::NALType::nuSliceIDR:
    case NALUnit::NALType::nuSliceNonIDR:
    case NALUnit::NALType::nuSliceA:
    case NALUnit::NALType::nuSliceB:
    case NALUnit::NALType::nuSliceC:
    case NALUnit::NALType::nuSliceExt:
        nalRez = processSliceNal(buff);
        return nalRez != 0 ? nalRez : 0;
    default:
        return 0;
    }

    uint8_t *nextNal = NALUnit::findNextNAL(buff, m_bufEnd);
    while (true)
    {
        if (nextNal == m_bufEnd)
            return NOT_ENOUGH_BUFFER;
        switch (static_cast<NALUnit::NALType>(*nextNal & 0x1f))
        {
        case NALUnit::NALType::nuSEI:
            nalRez = processSEI(nextNal);
            if (nalRez != 0)
                return nalRez;

            break;
        case NALUnit::NALType::nuDRD:
            if (m_blurayMode)
                m_delimiterFound = true;
            break;
        case NALUnit::NALType::nuDelimiter:
            // LTRACE(LT_DEBUG, 0, "NAUD type " << int32ToStr(nextNal[1],16));
            m_delimiterFound = true;
            break;
        case NALUnit::NALType::nuSPS:
        case NALUnit::NALType::nuSubSPS:
            // LTRACE(LT_DEBUG, 0, "SPS");
            nalRez = processSPS(nextNal);
            if (nalRez != 0)
                return nalRez;
            m_spsCounter++;
            break;
        case NALUnit::NALType::nuPPS:
            // LTRACE(LT_DEBUG, 0, "PPS");
            nalRez = processPPS(nextNal);
            if (nalRez != 0)
                return nalRez;
            m_spsPpsFound = true;
            break;
        case NALUnit::NALType::nuSliceIDR:
            // m_openGOP = false;
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            nalRez = processSliceNal(nextNal);
            if (nalRez == 0)
            {
                m_lastDecodedPos = nextNal;
            }
            return nalRez;
        default:
            break;
        }
        nextNal = NALUnit::findNextNAL(nextNal, m_bufEnd);
    }
}